

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

void __thiscall ON_SerialNumberMap::ON_SerialNumberMap(ON_SerialNumberMap *this)

{
  ON_SN_BLOCK *this_00;
  ON_SerialNumberMapPrivate *this_01;
  ON_SerialNumberMap *this_local;
  
  this->m_private = (ON_SerialNumberMapPrivate *)0x0;
  this->m_sn_count = 0;
  this->m_sn_purged = 0;
  this->m_snblk_list_capacity = 0;
  this->m_snblk_list_count = 0;
  this->m_snblk_list = (ON_SN_BLOCK **)0x0;
  this->m_e_blk = (ON_SN_BLOCK *)0x0;
  this_00 = (ON_SN_BLOCK *)operator_new(0x70020);
  memset(this_00,0,0x70020);
  ON_SN_BLOCK::ON_SN_BLOCK(this_00);
  this->m_sn_block0 = this_00;
  this->m_reserved1 = '\0';
  this->m_reserved2 = '\0';
  this->m_reserved3 = '\0';
  this->m_bHashTableIsValid = '\0';
  this->m_hash_block_count = 0;
  this->m_hash_capacity = 0;
  this->m_hash_table_blocks = (SN_ELEMENT ***)0x0;
  this->m_active_id_count = 0;
  (this->m_inactive_id).Data1 = 0;
  (this->m_inactive_id).Data2 = 0;
  (this->m_inactive_id).Data3 = 0;
  (this->m_inactive_id).Data4[0] = '\0';
  (this->m_inactive_id).Data4[1] = '\0';
  (this->m_inactive_id).Data4[2] = '\0';
  (this->m_inactive_id).Data4[3] = '\0';
  (this->m_inactive_id).Data4[4] = '\0';
  (this->m_inactive_id).Data4[5] = '\0';
  (this->m_inactive_id).Data4[6] = '\0';
  (this->m_inactive_id).Data4[7] = '\0';
  this_01 = (ON_SerialNumberMapPrivate *)operator_new(0x10);
  memset(this_01,0,0x10);
  ON_SerialNumberMapPrivate::ON_SerialNumberMapPrivate(this_01);
  this->m_private = this_01;
  return;
}

Assistant:

ON_SerialNumberMap::ON_SerialNumberMap()
  : m_sn_block0(*(new ON_SN_BLOCK()))
{
  m_private = new ON_SerialNumberMapPrivate();
}